

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void DynamicContent(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  uint local_1c;
  uint msgcode;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  BVar1 = Level1_Enabled(doc);
  if (BVar1 != no) {
    local_1c = 0;
    if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_APPLET))
    {
      if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_SCRIPT)
         ) {
        if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
           (node->tag->id == TidyTag_OBJECT)) {
          local_1c = 0x2d6;
        }
      }
      else {
        local_1c = 0x2d5;
      }
    }
    else {
      local_1c = 0x2d4;
    }
    if (local_1c != 0) {
      prvTidyReportAccessError(doc,node,local_1c);
    }
  }
  return;
}

Assistant:

static void DynamicContent( TidyDocImpl* doc, Node* node )
{
    if (Level1_Enabled( doc ))
    {
        uint msgcode = 0;
        if ( nodeIsAPPLET(node) )
            msgcode = TEXT_EQUIVALENTS_REQUIRE_UPDATING_APPLET;
        else if ( nodeIsSCRIPT(node) )
            msgcode = TEXT_EQUIVALENTS_REQUIRE_UPDATING_SCRIPT;
        else if ( nodeIsOBJECT(node) )
            msgcode = TEXT_EQUIVALENTS_REQUIRE_UPDATING_OBJECT;

        if ( msgcode )
            TY_(ReportAccessError)( doc, node, msgcode );
    }
}